

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

BOOLEAN __thiscall BVStatic<2048UL>::Test(BVStatic<2048UL> *this,BVIndex i)

{
  BOOLEAN BVar1;
  BVIndex index;
  BVUnit *this_00;
  BVIndex i_local;
  BVStatic<2048UL> *this_local;
  
  AssertRange(this,i);
  this_00 = BitsFromIndex(this,i);
  index = BVUnitT<unsigned_long>::Offset(i);
  BVar1 = BVUnitT<unsigned_long>::Test(this_00,index);
  return BVar1;
}

Assistant:

BOOLEAN Test(BVIndex i) const
    {
        AssertRange(i);
        return this->BitsFromIndex(i)->Test(BVUnit::Offset(i));
    }